

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

int64_t __thiscall indk::NeuralNet::doFindEntry(NeuralNet *this,string *ename)

{
  pointer pcVar1;
  long *__s2;
  int iVar2;
  long lVar3;
  long lVar4;
  pointer ppVar5;
  int64_t iVar6;
  pointer ppVar7;
  pointer ppVar8;
  long *local_c8;
  size_t local_c0;
  long local_b8 [2];
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  pointer local_68;
  pointer local_60;
  NeuralNet *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  ppVar5 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = local_40;
  pcVar1 = (ename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + ename->_M_string_length);
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_50,local_48 + (long)local_50);
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,local_a0 + (long)local_a8);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_c8,local_c0 + (long)local_c8);
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  local_c8 = local_b8;
  local_58 = this;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_88,local_80 + (long)local_88);
  __s2 = local_c8;
  lVar3 = (long)ppVar8 - (long)ppVar5;
  lVar4 = (lVar3 >> 3) * 0x6db6db6db6db6db7 >> 2;
  if (0 < lVar4) {
    local_68 = ppVar5 + lVar4 * 4;
    lVar4 = lVar4 + 1;
    ppVar7 = ppVar5;
    ppVar5 = ppVar5 + 2;
    local_60 = ppVar8;
    do {
      ppVar8 = ppVar5;
      if (ppVar8[-2].first._M_string_length == local_c0) {
        if (local_c0 == 0) {
          ppVar8 = ppVar8 + -2;
          goto LAB_001158dd;
        }
        iVar2 = bcmp(ppVar8[-2].first._M_dataplus._M_p,__s2,local_c0);
        ppVar5 = ppVar7;
        if (iVar2 == 0) goto LAB_001158e0;
        if (ppVar8[-1].first._M_string_length == local_c0) {
          ppVar5 = ppVar8 + -1;
          goto LAB_0011579c;
        }
      }
      else if (ppVar8[-1].first._M_string_length == local_c0) {
        if (local_c0 == 0) {
          ppVar8 = ppVar8 + -1;
          goto LAB_001158dd;
        }
        ppVar5 = ppVar7 + 1;
LAB_0011579c:
        iVar2 = bcmp((ppVar5->first)._M_dataplus._M_p,__s2,local_c0);
        if (iVar2 == 0) goto LAB_001158e0;
      }
      if ((ppVar8->first)._M_string_length == local_c0) {
        if ((local_c0 == 0) ||
           (iVar2 = bcmp((ppVar8->first)._M_dataplus._M_p,__s2,local_c0), iVar2 == 0))
        goto LAB_001158dd;
        if (ppVar8[1].first._M_string_length == local_c0) {
          ppVar5 = ppVar8 + 1;
LAB_001157fc:
          iVar2 = bcmp((ppVar5->first)._M_dataplus._M_p,__s2,local_c0);
          if (iVar2 == 0) goto LAB_001158e0;
        }
      }
      else if (ppVar8[1].first._M_string_length == local_c0) {
        if (local_c0 != 0) {
          ppVar5 = ppVar7 + 3;
          goto LAB_001157fc;
        }
        ppVar8 = ppVar8 + 1;
        goto LAB_001158dd;
      }
      ppVar7 = ppVar7 + 4;
      lVar4 = lVar4 + -1;
      ppVar5 = ppVar8 + 4;
    } while (1 < lVar4);
    lVar3 = (long)local_60 - (long)local_68;
    ppVar5 = local_68;
    ppVar8 = local_60;
  }
  lVar3 = (lVar3 >> 3) * 0x6db6db6db6db6db7;
  if (lVar3 == 1) {
LAB_001158a8:
    if (((ppVar5->first)._M_string_length == local_c0) &&
       ((local_c0 == 0 || (iVar2 = bcmp((ppVar5->first)._M_dataplus._M_p,__s2,local_c0), iVar2 == 0)
        ))) goto LAB_001158e0;
  }
  else {
    if (lVar3 == 2) {
LAB_00115886:
      if (((ppVar5->first)._M_string_length == local_c0) &&
         ((local_c0 == 0 ||
          (iVar2 = bcmp((ppVar5->first)._M_dataplus._M_p,__s2,local_c0), iVar2 == 0))))
      goto LAB_001158e0;
      ppVar5 = ppVar5 + 1;
      goto LAB_001158a8;
    }
    if (lVar3 == 3) {
      if (((ppVar5->first)._M_string_length == local_c0) &&
         ((local_c0 == 0 ||
          (iVar2 = bcmp((ppVar5->first)._M_dataplus._M_p,__s2,local_c0), iVar2 == 0))))
      goto LAB_001158e0;
      ppVar5 = ppVar5 + 1;
      goto LAB_00115886;
    }
  }
LAB_001158dd:
  ppVar5 = ppVar8;
LAB_001158e0:
  if (__s2 != local_b8) {
    operator_delete(__s2,local_b8[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (ppVar5 == (local_58->Entries).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar6 = -1;
  }
  else {
    iVar6 = ((long)ppVar5 -
             (long)(local_58->Entries).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  }
  return iVar6;
}

Assistant:

int64_t indk::NeuralNet::doFindEntry(const std::string& ename) {
    auto ne = std::find_if(Entries.begin(), Entries.end(), [ename](const std::pair<std::string, std::vector<std::string>>& e){
        return e.first == ename;
    });
    if (ne == Entries.end()) return -1;
    return std::distance(Entries.begin(), ne);
}